

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void load_cabal_items(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int vnum;
  int inum;
  CHAR_DATA *mob;
  OBJ_DATA *obj;
  FILE *fp;
  int in_stack_0000008c;
  OBJ_INDEX_DATA *in_stack_00000090;
  FILE *in_stack_00002400;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffffe8;
  int vnum_00;
  CHAR_DATA *pCVar5;
  
  if ((mPort == 9999) && (__stream = fopen("../configs/citems.txt","r"), __stream != (FILE *)0x0)) {
    while( true ) {
      vnum_00 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
      iVar2 = fread_number(in_stack_00002400);
      if (iVar2 == -1) break;
      iVar3 = fread_number(in_stack_00002400);
      get_obj_index(vnum_00);
      create_object(in_stack_00000090,in_stack_0000008c);
      pCVar5 = char_list;
      if (iVar3 == 0) {
        uVar4 = 0;
        for (; pCVar5 != (CHAR_DATA *)0x0; pCVar5 = pCVar5->next) {
          if ((pCVar5->cabal == iVar2) && (bVar1 = is_cabal_guard(pCVar5), bVar1)) {
            obj_to_char((OBJ_DATA *)CONCAT44(iVar2,uVar4),in_stack_ffffffffffffffd8);
          }
        }
        in_stack_ffffffffffffffe8 = 0;
      }
      else {
        for (; pCVar5 != (CHAR_DATA *)0x0; pCVar5 = pCVar5->next) {
          if (pCVar5->pIndexData->vnum == iVar3) {
            obj_to_char((OBJ_DATA *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffffd8);
          }
        }
        in_stack_ffffffffffffffe8 = 0;
      }
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void load_cabal_items(void)
{
	FILE *fp;
	OBJ_DATA *obj;
	CHAR_DATA *mob;

	int inum, vnum;

	if (mPort != 9999)
		return;

	fp = fopen(CABAL_ITEMS_FILE, "r");

	if (!fp)
		return;

	while ((inum = fread_number(fp)) != -1)
	{
		vnum = fread_number(fp);
		obj = create_object(get_obj_index(cabal_table[inum].item_vnum), 0);

		if (!vnum)
		{
			for (mob = char_list; mob; mob = mob->next)
			{
				if (mob->cabal == inum && is_cabal_guard(mob))
					obj_to_char(obj, mob);
			}

			continue;
		}

		for (mob = char_list; mob; mob = mob->next)
		{
			if (mob->pIndexData->vnum == vnum)
				obj_to_char(obj, mob);
		}
	}

	fclose(fp);
}